

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O0

CURLcode ftp_state_list(connectdata *conn)

{
  CURLcode CVar1;
  char *pcVar2;
  char *pcVar3;
  char *local_70;
  char *local_58;
  size_t local_50;
  size_t n;
  char *inpath;
  char *slashPos;
  char *lstArg;
  char *cmd;
  Curl_easy *data;
  connectdata *pcStack_18;
  CURLcode result;
  connectdata *conn_local;
  
  data._4_4_ = 0;
  cmd = (char *)conn->data;
  pcVar3 = (((Curl_easy *)cmd)->state).path;
  slashPos = (char *)0x0;
  pcStack_18 = conn;
  if (((((((Curl_easy *)cmd)->set).ftp_filemethod == FTPFILE_NOCWD) && (pcVar3 != (char *)0x0)) &&
      (*pcVar3 != '\0')) && (pcVar2 = strchr(pcVar3,0x2f), pcVar2 != (char *)0x0)) {
    local_50 = strlen(pcVar3);
    if (pcVar3[local_50 - 1] != '/') {
      pcVar2 = strrchr(pcVar3,0x2f);
      local_50 = (long)pcVar2 - (long)pcVar3;
    }
    CVar1 = Curl_urldecode((Curl_easy *)cmd,pcVar3,local_50,&slashPos,(size_t *)0x0,true);
    if (CVar1 != CURLE_OK) {
      return CVar1;
    }
    data._4_4_ = 0;
  }
  if (*(long *)(cmd + 0x820) == 0) {
    local_58 = "LIST";
    if ((cmd[0x796] & 1U) != 0) {
      local_58 = "NLST";
    }
  }
  else {
    local_58 = *(char **)(cmd + 0x820);
  }
  pcVar3 = "";
  if (slashPos == (char *)0x0) {
    local_70 = "";
  }
  else {
    pcVar3 = " ";
    local_70 = slashPos;
  }
  lstArg = curl_maprintf("%s%s%s",local_58,pcVar3,local_70);
  if (lstArg == (char *)0x0) {
    (*Curl_cfree)(slashPos);
    conn_local._4_4_ = CURLE_OUT_OF_MEMORY;
  }
  else {
    data._4_4_ = Curl_pp_sendf(&(pcStack_18->proto).ftpc.pp,"%s",lstArg);
    (*Curl_cfree)(slashPos);
    (*Curl_cfree)(lstArg);
    if (data._4_4_ == CURLE_OK) {
      _state(pcStack_18,FTP_LIST);
      conn_local._4_4_ = data._4_4_;
    }
    else {
      conn_local._4_4_ = data._4_4_;
    }
  }
  return conn_local._4_4_;
}

Assistant:

static CURLcode ftp_state_list(struct connectdata *conn)
{
  CURLcode result = CURLE_OK;
  struct Curl_easy *data = conn->data;

  /* If this output is to be machine-parsed, the NLST command might be better
     to use, since the LIST command output is not specified or standard in any
     way. It has turned out that the NLST list output is not the same on all
     servers either... */

  /*
     if FTPFILE_NOCWD was specified, we are currently in
     the user's home directory, so we should add the path
     as argument for the LIST / NLST / or custom command.
     Whether the server will support this, is uncertain.

     The other ftp_filemethods will CWD into dir/dir/ first and
     then just do LIST (in that case: nothing to do here)
  */
  char *cmd, *lstArg, *slashPos;
  const char *inpath = data->state.path;

  lstArg = NULL;
  if((data->set.ftp_filemethod == FTPFILE_NOCWD) &&
     inpath && inpath[0] && strchr(inpath, '/')) {
    size_t n = strlen(inpath);

    /* Check if path does not end with /, as then we cut off the file part */
    if(inpath[n - 1] != '/') {
      /* chop off the file part if format is dir/dir/file */
      slashPos = strrchr(inpath, '/');
      n = slashPos - inpath;
    }
    result = Curl_urldecode(data, inpath, n, &lstArg, NULL, TRUE);
    if(result)
      return result;
  }

  cmd = aprintf("%s%s%s",
                data->set.str[STRING_CUSTOMREQUEST]?
                data->set.str[STRING_CUSTOMREQUEST]:
                (data->set.ftp_list_only?"NLST":"LIST"),
                lstArg? " ": "",
                lstArg? lstArg: "");

  if(!cmd) {
    free(lstArg);
    return CURLE_OUT_OF_MEMORY;
  }

  result = Curl_pp_sendf(&conn->proto.ftpc.pp, "%s", cmd);

  free(lstArg);
  free(cmd);

  if(result)
    return result;

  state(conn, FTP_LIST);

  return result;
}